

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O2

char * cbor_print_bytes_part(char *out,char *out_max,uint8_t *in,int64_t val)

{
  char *pcVar1;
  long lVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  
  lVar2 = 0;
  for (pcVar1 = out + 1; (lVar2 < val && (pcVar1 < out_max)); pcVar1 = pcVar1 + 2) {
    bVar3 = in[lVar2];
    cVar5 = (bVar3 >> 4) + 0x57;
    if (bVar3 < 0xa0) {
      cVar5 = (bVar3 >> 4) + 0x30;
    }
    bVar3 = bVar3 & 0xf;
    cVar4 = bVar3 + 0x57;
    if (bVar3 < 10) {
      cVar4 = bVar3 + 0x30;
    }
    pcVar1[-1] = cVar5;
    *pcVar1 = cVar4;
    lVar2 = lVar2 + 1;
  }
  return pcVar1 + -1;
}

Assistant:

char* cbor_print_bytes_part(char* out, char const* out_max, uint8_t* in, int64_t val)
{
    for (int64_t i = 0; i < val && out + 1 < out_max; i++) {
        int c = in[i];
        *out++ = hex_to_char(c >> 4);
		*out++ = hex_to_char(c);
    }

    return out;
}